

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EqualsTypeClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EqualsTypeClauseSyntax,slang::parsing::Token&,slang::syntax::DataTypeSyntax&>
          (BumpAllocator *this,Token *args,DataTypeSyntax *args_1)

{
  Token equals;
  EqualsTypeClauseSyntax *this_00;
  DataTypeSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (EqualsTypeClauseSyntax *)allocate(this,0x28,8);
  equals.kind = args->kind;
  equals._2_1_ = args->field_0x2;
  equals.numFlags.raw = (args->numFlags).raw;
  equals.rawLen = args->rawLen;
  equals.info = args->info;
  slang::syntax::EqualsTypeClauseSyntax::EqualsTypeClauseSyntax(this_00,equals,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }